

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

bool __thiscall ON_LayerPrivate::operator==(ON_LayerPrivate *this,ON_LayerPrivate *other)

{
  bool bVar1;
  ON_ModelComponentContentMark local_80;
  ON_ModelComponentContentMark local_58;
  element_type *local_30;
  ON_SectionStyle *customOther;
  ON_SectionStyle *customThis;
  ON_LayerPrivate *other_local;
  ON_LayerPrivate *this_local;
  
  if (this == other) {
    this_local._7_1_ = true;
  }
  else {
    customThis = (ON_SectionStyle *)other;
    other_local = this;
    customOther = std::__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_30 = std::__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2> *)customThis);
    if ((customOther == (ON_SectionStyle *)0x0) && (local_30 != (element_type *)0x0)) {
      this_local._7_1_ = false;
    }
    else if ((customOther == (ON_SectionStyle *)0x0) || (local_30 != (element_type *)0x0)) {
      if ((customOther != (ON_SectionStyle *)0x0) && (local_30 != (element_type *)0x0)) {
        ON_ModelComponentContentMark::ON_ModelComponentContentMark
                  (&local_58,&customOther->super_ON_ModelComponent);
        ON_ModelComponentContentMark::ON_ModelComponentContentMark
                  (&local_80,&local_30->super_ON_ModelComponent);
        bVar1 = ::operator!=(&local_58,&local_80);
        if (bVar1) {
          return false;
        }
      }
      if ((this->m_visible_in_new_details & 1U) ==
          ((byte)(customThis->super_ON_ModelComponent).m_runtime_serial_number & 1)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_LayerPrivate::operator==(const ON_LayerPrivate& other) const
{
  if (this == &other)
    return true;

  {
    const ON_SectionStyle* customThis = m_custom_section_style.get();
    const ON_SectionStyle* customOther = other.m_custom_section_style.get();
    if (nullptr == customThis && customOther)
      return false;
    if (customThis && nullptr == customOther)
      return false;
    if (customThis && customOther)
    {
      if ((*customThis) != (*customOther))
        return false;
    }
  }

  if (m_visible_in_new_details != other.m_visible_in_new_details)
    return false;

  return true;
}